

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.cc
# Opt level: O3

void __thiscall flow::TargetCodeGenerator::emitLoad(TargetCodeGenerator *this,Value *value)

{
  FlowNumber value_00;
  long lVar1;
  size_t sVar2;
  StackPointer SVar3;
  StackPointer SVar4;
  undefined8 extraout_RAX;
  long lVar5;
  Operand OVar6;
  Opcode OVar7;
  ulong uVar8;
  undefined4 *puVar9;
  undefined8 *puVar10;
  undefined4 *puVar11;
  undefined8 *puVar12;
  byte bVar13;
  undefined1 local_78 [80];
  
  bVar13 = 0;
  if (value == (Value *)0x0) {
LAB_00136ffe:
    SVar3 = getStackPointer(this,value);
    if (SVar3 != 0xffffffffffffffff) {
      SVar4 = getStackPointer(this);
      if (SVar3 == SVar4 - 1) {
        return;
      }
      if ((long)(value->uses_).super__Vector_base<flow::Instr_*,_std::allocator<flow::Instr_*>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(value->uses_).super__Vector_base<flow::Instr_*,_std::allocator<flow::Instr_*>_>.
                _M_impl.super__Vector_impl_data._M_start == 8) {
        emitInstr(this,STACKROT,(Operand)SVar3);
        return;
      }
      emitInstr(this,LOAD,(Operand)SVar3);
      push(this,value);
      return;
    }
    emitLoad();
switchD_00136f65_default:
    emitLoad();
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_78);
    _Unwind_Resume(extraout_RAX);
  }
  lVar1 = __dynamic_cast(value,&Value::typeinfo,&ConstantValue<long,(flow::LiteralType)2>::typeinfo,
                         0);
  if (lVar1 == 0) {
    lVar1 = __dynamic_cast(value,&Value::typeinfo,
                           &ConstantValue<bool,(flow::LiteralType)1>::typeinfo,0);
    if (lVar1 == 0) {
      lVar1 = __dynamic_cast(value,&Value::typeinfo,
                             &ConstantValue<std::__cxx11::string,(flow::LiteralType)3>::typeinfo,0);
      if (lVar1 == 0) {
        lVar1 = __dynamic_cast(value,&Value::typeinfo,
                               &ConstantValue<flow::util::IPAddress,(flow::LiteralType)5>::typeinfo,
                               0);
        if (lVar1 == 0) {
          lVar1 = __dynamic_cast(value,&Value::typeinfo,
                                 &ConstantValue<flow::util::Cidr,(flow::LiteralType)6>::typeinfo,0);
          if (lVar1 == 0) {
            lVar1 = __dynamic_cast(value,&Value::typeinfo,&ConstantArray::typeinfo,0);
            if (lVar1 == 0) {
              lVar1 = __dynamic_cast(value,&Value::typeinfo,
                                     &ConstantValue<flow::util::RegExp,(flow::LiteralType)7>::
                                      typeinfo,0);
              if (lVar1 != 0) {
                util::RegExp::RegExp((RegExp *)local_78,(RegExp *)(lVar1 + 0x48));
                sVar2 = ConstantPool::makeRegExp(&this->cp_,(RegExp *)local_78);
                emitInstr(this,ILOAD,(Operand)sVar2);
                util::RegExp::~RegExp((RegExp *)local_78);
                goto LAB_00136f19;
              }
              goto LAB_00136ffe;
            }
            switch(*(undefined4 *)(lVar1 + 8)) {
            case 9:
              convert<long,flow::ConstantValue<long,(flow::LiteralType)2>>
                        ((vector<long,_std::allocator<long>_> *)local_78,(flow *)(lVar1 + 0x48),
                         (vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *)
                         &switchD_00136f65::switchdataD_00169a8c);
              sVar2 = ConstantPool::makeIntegerArray
                                (&this->cp_,(vector<long,_std::allocator<long>_> *)local_78);
              emitInstr(this,ITLOAD,(Operand)sVar2);
              break;
            case 10:
              convert<std::__cxx11::string,flow::ConstantValue<std::__cxx11::string,(flow::LiteralType)3>>
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_78,(flow *)(lVar1 + 0x48),
                         (vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *)
                         &switchD_00136f65::switchdataD_00169a8c);
              sVar2 = ConstantPool::makeStringArray
                                (&this->cp_,
                                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  *)local_78);
              emitInstr(this,STLOAD,(Operand)sVar2);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_78);
              goto LAB_00136f19;
            case 0xb:
              convert<flow::util::IPAddress,flow::ConstantValue<flow::util::IPAddress,(flow::LiteralType)5>>
                        ((vector<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_> *)
                         local_78,(flow *)(lVar1 + 0x48),
                         (vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *)
                         &switchD_00136f65::switchdataD_00169a8c);
              sVar2 = ConstantPool::makeIPaddrArray
                                (&this->cp_,
                                 (vector<flow::util::IPAddress,_std::allocator<flow::util::IPAddress>_>
                                  *)local_78);
              emitInstr(this,PTLOAD,(Operand)sVar2);
              break;
            case 0xc:
              convert<flow::util::Cidr,flow::ConstantValue<flow::util::Cidr,(flow::LiteralType)6>>
                        ((vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_> *)local_78,
                         (flow *)(lVar1 + 0x48),
                         (vector<flow::Constant_*,_std::allocator<flow::Constant_*>_> *)
                         &switchD_00136f65::switchdataD_00169a8c);
              sVar2 = ConstantPool::makeCidrArray
                                (&this->cp_,
                                 (vector<flow::util::Cidr,_std::allocator<flow::util::Cidr>_> *)
                                 local_78);
              emitInstr(this,CTLOAD,(Operand)sVar2);
              break;
            default:
              goto switchD_00136f65_default;
            }
            if ((pointer)local_78._0_8_ == (pointer)0x0) goto LAB_00136f19;
            uVar8 = local_78._16_8_ - local_78._0_8_;
            goto LAB_00136e6b;
          }
          puVar10 = (undefined8 *)(lVar1 + 0x48);
          puVar12 = (undefined8 *)local_78;
          for (lVar5 = 10; lVar5 != 0; lVar5 = lVar5 + -1) {
            *puVar12 = *puVar10;
            puVar10 = puVar10 + (ulong)bVar13 * -2 + 1;
            puVar12 = puVar12 + (ulong)bVar13 * -2 + 1;
          }
          sVar2 = ConstantPool::makeCidr(&this->cp_,(Cidr *)local_78);
          OVar6 = (Operand)sVar2;
          OVar7 = CLOAD;
        }
        else {
          puVar9 = (undefined4 *)(lVar1 + 0x48);
          puVar11 = (undefined4 *)local_78;
          for (lVar5 = 0x11; lVar5 != 0; lVar5 = lVar5 + -1) {
            *puVar11 = *puVar9;
            puVar9 = puVar9 + (ulong)bVar13 * -2 + 1;
            puVar11 = puVar11 + (ulong)bVar13 * -2 + 1;
          }
          sVar2 = ConstantPool::makeIPAddress(&this->cp_,(IPAddress *)local_78);
          OVar6 = (Operand)sVar2;
          OVar7 = PLOAD;
        }
        emitInstr(this,OVar7,OVar6);
      }
      else {
        local_78._0_8_ = local_78 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_78,*(long *)(lVar1 + 0x48),
                   *(long *)(lVar1 + 0x50) + *(long *)(lVar1 + 0x48));
        sVar2 = ConstantPool::makeString(&this->cp_,(string *)local_78);
        emitInstr(this,SLOAD,(Operand)sVar2);
        if ((undefined1 *)local_78._0_8_ == local_78 + 0x10) goto LAB_00136f19;
        uVar8 = local_78._16_8_ + 1;
LAB_00136e6b:
        operator_delete((void *)local_78._0_8_,uVar8);
      }
LAB_00136f19:
      changeStack(this,0,value);
      return;
    }
    OVar6 = (Operand)*(byte *)(lVar1 + 0x48);
  }
  else {
    value_00 = *(FlowNumber *)(lVar1 + 0x48);
    if (0xffff < value_00) {
      sVar2 = ConstantPool::makeInteger(&this->cp_,value_00);
      OVar6 = (Operand)sVar2;
      OVar7 = NLOAD;
      goto LAB_00136dd9;
    }
    OVar6 = (Operand)value_00;
  }
  OVar7 = ILOAD;
LAB_00136dd9:
  emitInstr(this,OVar7,OVar6);
  changeStack(this,0,value);
  return;
}

Assistant:

void TargetCodeGenerator::emitLoad(Value* value) {
  // const int
  if (auto integer = dynamic_cast<ConstantInt*>(value)) {
    // FIXME this constant initialization should pretty much be done in the entry block
    FlowNumber number = integer->get();
    if (number <= std::numeric_limits<Operand>::max()) {
      emitInstr(Opcode::ILOAD, number);
      changeStack(0, value);
    } else {
      emitInstr(Opcode::NLOAD, cp_.makeInteger(number));
      changeStack(0, value);
    }
    return;
  }

  // const boolean
  if (auto boolean = dynamic_cast<ConstantBoolean*>(value)) {
    emitInstr(Opcode::ILOAD, boolean->get());
    changeStack(0, value);
    return;
  }

  // const string
  if (auto str = dynamic_cast<ConstantString*>(value)) {
    emitInstr(Opcode::SLOAD, cp_.makeString(str->get()));
    changeStack(0, value);
    return;
  }

  // const ip
  if (auto ip = dynamic_cast<ConstantIP*>(value)) {
    emitInstr(Opcode::PLOAD, cp_.makeIPAddress(ip->get()));
    changeStack(0, value);
    return;
  }

  // const cidr
  if (auto cidr = dynamic_cast<ConstantCidr*>(value)) {
    emitInstr(Opcode::CLOAD, cp_.makeCidr(cidr->get()));
    changeStack(0, value);
    return;
  }

  // const array<T>
  if (auto array = dynamic_cast<ConstantArray*>(value)) {
    switch (array->type()) {
      case LiteralType::IntArray:
        emitInstr(Opcode::ITLOAD,
             cp_.makeIntegerArray(
                 convert<FlowNumber, ConstantInt>(array->get())));
        changeStack(0, value);
        break;
      case LiteralType::StringArray:
        emitInstr(Opcode::STLOAD,
             cp_.makeStringArray(
                 convert<std::string, ConstantString>(array->get())));
        changeStack(0, value);
        break;
      case LiteralType::IPAddrArray:
        emitInstr(Opcode::PTLOAD,
             cp_.makeIPaddrArray(convert<util::IPAddress, ConstantIP>(array->get())));
        changeStack(0, value);
        break;
      case LiteralType::CidrArray:
        emitInstr(Opcode::CTLOAD,
             cp_.makeCidrArray(convert<util::Cidr, ConstantCidr>(array->get())));
        changeStack(0, value);
        break;
      default:
        fprintf(stderr, "BUG: Unsupported array type in target code generator.");
        abort();
    }
    return;
  }

  // const regex
  if (auto re = dynamic_cast<ConstantRegExp*>(value)) {
    // TODO emitInstr(Opcode::RLOAD, re->get());
    emitInstr(Opcode::ILOAD, cp_.makeRegExp(re->get()));
    changeStack(0, value);
    return;
  }

  // if value is already on stack, dup to top
  StackPointer si = getStackPointer(value);
  FLOW_ASSERT(si != static_cast<size_t>(-1),
              "BUG: emitLoad: value not yet on the stack but referenced as operand.");

  if (si == getStackPointer() - 1)
    return;

  if (value->useCount() == 1) {
    // XXX only used once, so move value to stack top
    emitInstr(Opcode::STACKROT, si);
    return;
  }

  // XXX duplicate value onto stack top
  emitInstr(Opcode::LOAD, si);
  push(value);
}